

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::extMul<8ul,unsigned_char,unsigned_short,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  Type *other;
  uint uVar1;
  uint uVar2;
  Literal *val;
  Literal *this_00;
  long lVar3;
  Literal *this_01;
  bool bVar4;
  undefined1 local_420 [8];
  LaneArray<8UL_*_2> lhs;
  LaneArray<8UL_*_2> rhs;
  LaneArray<8UL> result;
  Literal *local_38;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)local_420,this,a);
  getLanes<unsigned_char,16>((LaneArray<16> *)&lhs._M_elems[0xf].type,(wasm *)a,val);
  this_00 = (Literal *)&rhs._M_elems[0xf].type;
  memset(this_00,0,0xc0);
  local_38 = (Literal *)&rhs._M_elems[7].type;
  this_01 = (Literal *)&lhs._M_elems[7].type;
  lVar3 = 8;
  other = &result._M_elems[7].type;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    uVar1 = Literal::geti32(this_01);
    uVar2 = Literal::geti32(local_38);
    result._M_elems[7].type.id._0_4_ = (uVar2 & 0xff) * (uVar1 & 0xff);
    if (this_00 != (Literal *)other) {
      Literal::~Literal(this_00);
      Literal::Literal(this_00,(Literal *)other);
    }
    Literal::~Literal((Literal *)other);
    this_00 = this_00 + 1;
    local_38 = local_38 + 1;
    this_01 = this_01 + 1;
  }
  Literal::Literal(__return_storage_ptr__,(LaneArray<8> *)&rhs._M_elems[0xf].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&rhs._M_elems[0xf].type);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)&lhs._M_elems[0xf].type);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_420);
  return __return_storage_ptr__;
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}